

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfo.cpp
# Opt level: O3

void GmmResFree(GMM_RESOURCE_INFO *pRes)

{
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  undefined1 local_638 [520];
  undefined1 local_430 [520];
  undefined1 local_228 [520];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (pRes != (GMM_RESOURCE_INFO *)0x0) {
    iVar1 = (*(pRes->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])();
    if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 0xd) & 2) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        (*(pRes->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[4])(pRes);
        return;
      }
      goto LAB_0019cc98;
    }
    memset(local_638,0,0x618);
    (pRes->super_GmmResourceInfoCommon).ClientType = GMM_KMD_VISTA;
    memset(&(pRes->super_GmmResourceInfoCommon).Surf,0,0x208);
    memcpy(&(pRes->super_GmmResourceInfoCommon).AuxSurf,local_430,0x208);
    memcpy(&(pRes->super_GmmResourceInfoCommon).AuxSecSurf,local_228,0x208);
    (pRes->super_GmmResourceInfoCommon).RotateInfo = 0;
    (pRes->super_GmmResourceInfoCommon).pPrivateData = 0;
    (pRes->super_GmmResourceInfoCommon).MultiTileArch.field_0x0 = 0;
    (pRes->super_GmmResourceInfoCommon).MultiTileArch.GpuVaMappingSet = '\0';
    (pRes->super_GmmResourceInfoCommon).MultiTileArch.LocalMemEligibilitySet = '\0';
    (pRes->super_GmmResourceInfoCommon).MultiTileArch.LocalMemPreferredSet = '\0';
    (pRes->super_GmmResourceInfoCommon).MultiTileArch.Reserved = 0;
    (pRes->super_GmmResourceInfoCommon).ExistingSysMem.pExistingSysMem = 0;
    (pRes->super_GmmResourceInfoCommon).ExistingSysMem.pVirtAddress = 0;
    (pRes->super_GmmResourceInfoCommon).ExistingSysMem.pGfxAlignedVirtAddress = 0;
    (pRes->super_GmmResourceInfoCommon).ExistingSysMem.Size = 0;
    *(undefined8 *)&(pRes->super_GmmResourceInfoCommon).ExistingSysMem.IsGmmAllocated = 0;
    (pRes->super_GmmResourceInfoCommon).SvmAddress = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0019cc98:
  __stack_chk_fail();
}

Assistant:

void GMM_STDCALL GmmResFree(GMM_RESOURCE_INFO *pRes)
{
    GMM_DPF_ENTER;
    __GMM_ASSERTPTR(pRes, VOIDRETURN);

#if(!defined(__GMM_KMD__) && !defined(GMM_UNIFIED_LIB))
    GmmResFreeThroughClientCtxt(pRes);
#else

    if(pRes->GetResFlags().Info.__PreallocatedResInfo)
    {
        *pRes = GmmLib::GmmResourceInfo();
    }
    else
    {
        delete pRes;
        pRes = NULL;
    }

#endif
}